

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void character_behaviour(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  uint8_t uVar4;
  uint16_t *puVar5;
  mappos16_t *pmVar6;
  long lVar7;
  char cVar8;
  byte bVar9;
  short sVar10;
  short sVar11;
  
  if ((vischar->counter_and_flags & 0xf) != 0) {
    vischar->counter_and_flags = vischar->counter_and_flags - 1;
    return;
  }
  switch(vischar->flags) {
  case '\x02':
    if (state->automatic_player_counter == '\0') goto LAB_0010ad07;
  case '\x01':
    (vischar->target).u = (state->hero_mappos).u;
    uVar4 = (state->hero_mappos).v;
LAB_0010acbd:
    (vischar->target).v = uVar4;
    break;
  case '\x03':
    if (-1 < (char)state->item_structs[7].room_and_flags) {
      vischar->flags = '\0';
      (vischar->route).index = 0xff;
      (vischar->route).step = '\0';
      get_target_assign_pos(state,vischar,&vischar->route);
      return;
    }
    (vischar->target).u = state->item_structs[7].mappos.u;
    uVar4 = state->item_structs[7].mappos.v;
    goto LAB_0010acbd;
  case '\x04':
    if (state->bribed_character != 0xff) {
      puVar5 = &state->vischars[1].mi.mappos.v;
      cVar8 = -7;
LAB_0010acf6:
      if (*(uint8_t *)(puVar5 + -0x11) != state->bribed_character) goto code_r0x0010acff;
      if (state->room_index == '\0') {
        pmVar6 = (mappos16_t *)(puVar5 + -1);
        lVar7 = 0;
        do {
          puVar5 = &pmVar6->u;
          pmVar6 = (mappos16_t *)&pmVar6->v;
          (&(vischar->target).u)[lVar7] = (uint8_t)(*puVar5 + 4 >> 3);
          lVar7 = lVar7 + 1;
        } while ((char)lVar7 != '\x03');
        break;
      }
      (vischar->target).u = (uint8_t)((mappos16_t *)(puVar5 + -1))->u;
      uVar4 = (uint8_t)*puVar5;
      goto LAB_0010acbd;
    }
LAB_0010ad07:
    vischar->flags = '\0';
    get_target_assign_pos(state,vischar,&vischar->route);
    return;
  default:
    if ((vischar->route).index == '\0') {
      if (vischar->input == '\0') {
        return;
      }
      vischar->input = 0x80;
      return;
    }
  }
  sVar10 = 1;
  if (state->room_index == '\0') {
    sVar10 = (ushort)((vischar->flags & 0x40) == 0) * 4 + 4;
  }
  bVar1 = vischar->counter_and_flags;
  if ((bVar1 & 0x20) == 0) {
    uVar2 = (vischar->mi).mappos.u;
    sVar11 = uVar2 - (ushort)(vischar->target).u * sVar10;
    bVar9 = 8;
    if ((2 < sVar11) || (bVar9 = 4, sVar11 < -2)) {
LAB_0010ada7:
      if (vischar->input == bVar9) {
        return;
      }
      vischar->input = bVar9 | 0x80;
      return;
    }
    vischar->counter_and_flags = bVar1 | 0x20;
    sVar10 = (vischar->mi).mappos.v - sVar10 * (ushort)(vischar->target).v;
    bVar9 = 5;
    if (2 < sVar10) goto LAB_0010ae00;
    bVar9 = 7;
  }
  else {
    sVar11 = (vischar->mi).mappos.v - (ushort)(vischar->target).v * sVar10;
    bVar9 = 5;
    if ((2 < sVar11) || (bVar9 = 7, sVar11 < -2)) goto LAB_0010ada7;
    vischar->counter_and_flags = bVar1 & 0xdf;
    uVar3 = (vischar->mi).mappos.u;
    sVar10 = uVar3 - sVar10 * (ushort)(vischar->target).u;
    bVar9 = 8;
    if (2 < sVar10) goto LAB_0010ae00;
    bVar9 = 4;
  }
  if (-3 < sVar10) {
    vischar->counter_and_flags = bVar1;
    target_reached(state,vischar);
    return;
  }
LAB_0010ae00:
  if (vischar->input == bVar9) {
    return;
  }
  vischar->input = bVar9 | 0x80;
  return;
code_r0x0010acff:
  puVar5 = puVar5 + 0x20;
  cVar8 = cVar8 + '\x01';
  if (cVar8 == '\0') goto LAB_0010ad07;
  goto LAB_0010acf6;
}

Assistant:

void character_behaviour(tgestate_t *state, vischar_t *vischar)
{
  uint8_t    flags;             /* was A */
  uint8_t    counter_and_flags; /* was B */
  uint8_t    iters;             /* was B */
  vischar_t *vischar2;          /* was HL */
  uint8_t    vischar2flags;     /* was C' */
  uint8_t    scale;             /* Conv: added */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Proceed into the character behaviour handling only when this delay field
   * hits zero. This stops characters navigating around obstacles too
   * quickly. */
  counter_and_flags = vischar->counter_and_flags; // Conv: Use of A dropped.
  if (counter_and_flags & vischar_BYTE7_COUNTER_MASK)
  {
    vischar->counter_and_flags = --counter_and_flags;
    return;
  }

  vischar2 = vischar; // no need for separate HL and IY now other code reduced
  flags = vischar2->flags;
  if (flags != 0)
  {
    /* Mode 1: Hero is chased by hostiles and sent to solitary if caught. */
    if (flags == vischar_PURSUIT_PURSUE)
    {
pursue_hero:
      /* Pursue the hero. */
      vischar2->target.u = state->hero_mappos.u;
      vischar2->target.v = state->hero_mappos.v;
      goto move;
    }
    /* Mode 2: Hero is chased by hostiles if under player control. */
    else if (flags == vischar_PURSUIT_HASSLE)
    {
      if (state->automatic_player_counter > 0)
      {
        /* The hero is under player control: pursue. */
        goto pursue_hero;
      }
      else
      {
        /* The hero is under automatic control: hostiles lose interest and
         * resume following their original route. */
        vischar2->flags = 0; /* clear vischar_PURSUIT_HASSLE */
        get_target_assign_pos(state, vischar2, &vischar2->route);
        return;
      }
    }
    /* Mode 3: The food item is near a guard dog. */
    else if (flags == vischar_PURSUIT_DOG_FOOD)
    {
      if (state->item_structs[item_FOOD].room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
      {
        /* Set dog target to poisoned food. */
        vischar2->target.u = state->item_structs[item_FOOD].mappos.u;
        vischar2->target.v = state->item_structs[item_FOOD].mappos.v;
        goto move;
      }
      else
      {
        /* Food is no longer nearby: Choose random locations in the fenced-
         * off area (right side). */
        vischar2->flags = 0; /* clear vischar_PURSUIT_DOG_FOOD */
        vischar2->route.index = routeindex_255_WANDER;
        vischar2->route.step  = 0; /* 0..7 */
        get_target_assign_pos(state, vischar2, &vischar2->route);
        return;
      }
    }
    /* Mode 4: Hostile character witnessed a bribe being given (in accept_bribe). */
    else if (flags == vischar_PURSUIT_SAW_BRIBE)
    {
      character_t  bribed_character; /* was A */
      vischar_t   *found;            /* was HL */

      bribed_character = state->bribed_character;
      if (bribed_character != character_NONE)
      {
        /* Iterate over non-player characters. */
        iters = vischars_LENGTH - 1;
        found = &state->vischars[1];
        do
        {
          if (found->character == bribed_character)
            goto bribed_visible;
          found++;
        }
        while (--iters);
      }

      /* Bribed character was not visible: hostiles lose interest and resume
       * following their original route. */
      vischar2->flags = 0; /* clear vischar_PURSUIT_SAW_BRIBE */
      get_target_assign_pos(state, vischar2, &vischar2->route);
      return;

bribed_visible:
      /* Found the bribed character in vischars: hostiles target him. */
      {
        mappos16_t *mappos; /* was HL */
        mappos8_t  *target; /* was DE */

        mappos = &found->mi.mappos;
        target = &vischar2->target;
        if (state->room_index == room_0_OUTDOORS)
        {
          /* Outdoors */
          scale_mappos_down(mappos, target);
        }
        else
        {
          /* Indoors */
          target->u = mappos->u; // note: narrowing
          target->v = mappos->v; // note: narrowing
        }
        goto move;
      }
    }
  }

  if (vischar2->route.index == routeindex_0_HALT) /* Stand still */
  {
    character_behaviour_set_input(state, vischar, 0 /* new_input */);
    return; /* was tail call */
  }

move:
  vischar2flags = vischar2->flags; // sampled = $8081, 80a1, 80e1, 8001, 8021, ...

  /* Conv: The original code here self modifies the vischar_move_u/v routines.
   *       The replacement code passes in a scale factor. */
  if (state->room_index > room_0_OUTDOORS)
    scale = 1; /* Indoors. */
  else if (vischar2flags & vischar_FLAGS_TARGET_IS_DOOR)
    scale = 4; /* Outdoors + door thing. */
  else
    scale = 8; /* Outdoors. */

  /* If the vischar_BYTE7_V_DOMINANT flag is set then we try moving on the v
   * axis then the u axis, rather than u then v. This is the code which makes
   * characters alternate left/right when navigating. */
  if (vischar->counter_and_flags & vischar_BYTE7_V_DOMINANT)
  {
    /* V dominant case */

    /* Conv: Inlined the chunk from $C9FF here. */

    input_t input; /* was A */

    input = vischar_move_v(state, vischar, scale);
    if (input)
    {
      character_behaviour_set_input(state, vischar, input);
    }
    else
    {
      input = vischar_move_u(state, vischar, scale);
      if (input)
        character_behaviour_set_input(state, vischar, input);
      else
        target_reached(state, vischar); /* was tail call */
    }
  }
  else
  {
    /* U dominant case */

    input_t input; /* was A */

    input = vischar_move_u(state, vischar, scale);
    if (input)
    {
      character_behaviour_set_input(state, vischar, input);
    }
    else
    {
      input = vischar_move_v(state, vischar, scale);
      if (input)
        character_behaviour_set_input(state, vischar, input);
      else
        target_reached(state, vischar); /* was tail call */
    }
  }
}